

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2VertexMap(LWOImporter *this,uint length,bool perPoly)

{
  ulong *puVar1;
  pointer *ppaVar2;
  pointer *ppfVar3;
  byte bVar4;
  uint8_t *puVar5;
  iterator __position;
  pointer pVVar6;
  iterator iVar7;
  pointer pUVar8;
  pointer pWVar9;
  Layer *pLVar10;
  bool bVar11;
  float fVar12;
  bool bVar13;
  int iVar14;
  byte *pbVar15;
  long *plVar16;
  uint *puVar17;
  ulong uVar18;
  float *pfVar19;
  Logger *pLVar20;
  runtime_error *this_00;
  byte bVar21;
  uint uVar22;
  long *plVar23;
  ulong uVar24;
  uint uVar25;
  undefined7 in_register_00000011;
  ulong uVar26;
  byte *pbVar27;
  aiVector3t<float> *__args;
  ushort uVar28;
  LWOImporter *this_01;
  long lVar29;
  VColorChannel *elem;
  pointer pVVar30;
  pointer pUVar31;
  pointer pWVar32;
  Layer *this_02;
  uint uVar33;
  ReferrerList *this_03;
  pointer pFVar34;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined4 local_23c;
  ulong local_238;
  LWOImporter *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  VMapEntry *local_208;
  uint *local_200;
  ulong local_1f8;
  pointer local_1f0;
  ulong local_1e8;
  uint local_1dc;
  ReferrerList *local_1d8;
  Layer *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [376];
  
  local_23c = (undefined4)CONCAT71(in_register_00000011,perPoly);
  if (length < 6) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"LWO: VMAP chunk is too small","");
    std::runtime_error::runtime_error(this_00,(string *)local_1a8);
    *(undefined ***)this_00 = &PTR__runtime_error_007fd498;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_200 = (uint *)this->mFileBuffer;
  uVar25 = *local_200;
  this->mFileBuffer = (uint8_t *)(local_200 + 1);
  uVar28 = (ushort)local_200[1];
  pbVar27 = (byte *)((long)local_200 + 6);
  this->mFileBuffer = pbVar27;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  if (*(byte *)((long)local_200 + 6) != 0) {
    pbVar15 = (byte *)((long)local_200 + 7);
    uVar22 = 1;
    do {
      if (length < uVar22) {
        pLVar20 = DefaultLogger::get();
        Logger::warn(pLVar20,"LWO: Invalid file, string is is too long");
        break;
      }
      this->mFileBuffer = pbVar15;
      uVar22 = uVar22 + 1;
      bVar21 = *pbVar15;
      pbVar15 = pbVar15 + 1;
    } while (bVar21 != 0);
  }
  puVar5 = this->mFileBuffer;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar27,puVar5);
  uVar22 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 | uVar25 << 0x18;
  local_238 = CONCAT62(local_238._2_6_,uVar28);
  uVar28 = uVar28 << 8 | uVar28 >> 8;
  local_230 = this;
  std::__cxx11::string::operator=((string *)&local_228,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  this_01 = local_230;
  local_230->mFileBuffer = local_230->mFileBuffer + (2 - (ulong)((int)puVar5 - (int)pbVar27 & 1));
  if ((int)uVar22 < 0x52474220) {
    if ((int)uVar22 < 0x4e4f524d) {
      if (uVar22 == 0x4d4e5657) {
LAB_003ee492:
        if ((short)local_238 != 0x100) {
          pLVar20 = DefaultLogger::get();
          std::operator+(&local_260,"LWO2: Skipping Weight Channel \'",&local_228);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_260);
          local_1a8._0_8_ = local_1a8 + 0x10;
          plVar23 = plVar16 + 2;
          if ((long *)*plVar16 == plVar23) {
            local_1a8._16_8_ = *plVar23;
            local_1a8._24_8_ = plVar16[3];
          }
          else {
            local_1a8._16_8_ = *plVar23;
            local_1a8._0_8_ = (long *)*plVar16;
          }
          local_1a8._8_8_ = plVar16[1];
          *plVar16 = (long)plVar23;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Logger::warn(pLVar20,(char *)local_1a8._0_8_);
          goto LAB_003ef117;
        }
        lVar29 = 0x48;
        if (uVar25 == 0x54484757) {
          lVar29 = 0x30;
        }
        local_208 = FindEntry<Assimp::LWO::WeightChannel>
                              ((vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                *)((long)&(local_230->mCurLayer->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar29),
                               &local_228,(bool)(char)local_23c);
LAB_003ee605:
        (*local_208->_vptr_VMapEntry[2])
                  (local_208,
                   (ulong)(uint)((int)((ulong)((long)(this_01->mCurLayer->mTempPoints).
                                                                                                          
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_01->mCurLayer->mTempPoints).
                                                                                                        
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                -0x55555555));
        local_200 = (uint *)((long)local_200 + (ulong)length);
        uVar25 = local_208->dims;
        if ((uint)uVar28 <= local_208->dims) {
          uVar25 = (uint)uVar28;
        }
        uVar26 = (ulong)uVar25;
        puVar17 = (uint *)this_01->mFileBuffer;
        local_1f8 = uVar26;
        if (puVar17 < local_200) {
          this_02 = this_01->mCurLayer;
          this_03 = &this_02->mPointReferrers;
          local_1dc = (int)((ulong)((long)(this_02->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_02->mTempPoints).
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555;
          local_1c0 = (ulong)((long)(this_02->mFaces).
                                    super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->mFaces).
                                   super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5;
          local_1b8 = (ulong)((uVar28 - uVar25) * 4);
          local_1b0 = (ulong)(uVar25 * 4);
          local_1e8 = uVar26;
          local_1d8 = this_03;
          local_1d0 = this_02;
          do {
            uVar25 = *puVar17;
            pbVar27 = (byte *)((long)puVar17 + 1);
            this_01->mFileBuffer = pbVar27;
            if ((byte)uVar25 == 0xff) {
              bVar21 = *(byte *)((long)puVar17 + 1);
              this_01->mFileBuffer = (byte *)((long)puVar17 + 2);
              bVar4 = *(byte *)((long)puVar17 + 2);
              pbVar27 = (byte *)((long)puVar17 + 3);
              this_01->mFileBuffer = pbVar27;
              uVar25 = (uint)bVar4 << 8 | (uint)bVar21 << 0x10;
              lVar29 = 4;
            }
            else {
              uVar25 = (uint)(byte)uVar25 << 8;
              lVar29 = 2;
            }
            bVar21 = *pbVar27;
            this_01->mFileBuffer = (byte *)((long)puVar17 + lVar29);
            uVar25 = (bVar21 | uVar25) + this_01->mCurLayer->mPointIDXOfs;
            local_238 = (ulong)uVar25;
            if (uVar25 < local_1dc) {
              if ((char)local_23c != '\0') {
                pbVar15 = this_01->mFileBuffer;
                bVar21 = *pbVar15;
                pbVar27 = pbVar15 + 1;
                this_01->mFileBuffer = pbVar27;
                if (bVar21 == 0xff) {
                  bVar21 = pbVar15[1];
                  this_01->mFileBuffer = pbVar15 + 2;
                  bVar4 = pbVar15[2];
                  pbVar27 = pbVar15 + 3;
                  this_01->mFileBuffer = pbVar27;
                  uVar22 = (uint)bVar4 << 8 | (uint)bVar21 << 0x10;
                  lVar29 = 4;
                }
                else {
                  uVar22 = (uint)bVar21 << 8;
                  lVar29 = 2;
                }
                bVar21 = *pbVar27;
                this_01->mFileBuffer = pbVar15 + lVar29;
                bVar11 = true;
                if (((local_208->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar25 >> 6] >>
                     (local_238 & 0x3f) & 1) != 0) {
                  uVar25 = (uVar22 | bVar21) + this_01->mCurLayer->mFaceIDXOfs;
                  if (uVar25 < (uint)local_1c0) {
                    pFVar34 = (this_02->mFaces).
                              super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (pFVar34[uVar25].super_aiFace.mNumIndices == 0) {
                      bVar13 = false;
                    }
                    else {
                      pFVar34 = pFVar34 + uVar25;
                      uVar24 = 0;
                      bVar13 = false;
                      local_1f0 = pFVar34;
                      do {
                        uVar25 = (pFVar34->super_aiFace).mIndices[uVar24];
                        uVar18 = local_238;
                        do {
                          uVar22 = (uint)uVar18;
                          if (uVar22 == uVar25) goto LAB_003ee90f;
                          uVar22 = (this_03->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar18 & 0xffffffff];
                          uVar18 = (ulong)uVar22;
                        } while (uVar22 != 0xffffffff);
                        uVar22 = 0xffffffff;
LAB_003ee90f:
                        local_1c8 = uVar24;
                        if (uVar22 != 0xffffffff) {
                          local_1a8._0_4_ = 0xffffffff;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                    (this_03,((long)(this_02->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_02->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2) +
                                             1,(value_type_conflict2 *)local_1a8);
                          uVar22 = (int)((ulong)((long)(this_02->mTempPoints).
                                                                                                              
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this_02->mTempPoints).
                                                                                                            
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                   -0x55555555;
                          local_238 = (ulong)uVar22;
                          (pFVar34->super_aiFace).mIndices[local_1c8] = uVar22;
                          AddToSingleLinkedList
                                    (this_03,uVar25,(pFVar34->super_aiFace).mIndices[local_1c8]);
                          __args = (this_02->mTempPoints).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar25;
                          __position._M_current =
                               (this_02->mTempPoints).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this_02->mTempPoints).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                            _M_realloc_insert<aiVector3t<float>const&>
                                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>
                                        *)this_02,__position,__args);
                          }
                          else {
                            (__position._M_current)->z = __args->z;
                            fVar12 = __args->y;
                            (__position._M_current)->x = __args->x;
                            (__position._M_current)->y = fVar12;
                            ppaVar2 = &(this_02->mTempPoints).
                                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                            *ppaVar2 = *ppaVar2 + 1;
                          }
                          pVVar30 = (this_01->mCurLayer->mVColorChannels).
                                    super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pVVar6 = (this_01->mCurLayer->mVColorChannels).
                                   super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          bVar21 = (byte)uVar25;
                          if (pVVar30 != pVVar6) {
                            do {
                              if ((pVVar30->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pVVar30->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar25 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pVVar30->super_VMapEntry).abAssigned,
                                           (ulong)(pVVar30->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pVVar30->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pVVar30->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pVVar30->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar33 = 0;
                                  do {
                                    pfVar19 = (pVVar30->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar25 * uVar22 + uVar33);
                                    iVar7._M_current =
                                         (pVVar30->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar7._M_current ==
                                        (pVVar30->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pVVar30->super_VMapEntry).rawData,iVar7,pfVar19);
                                    }
                                    else {
                                      *iVar7._M_current = *pfVar19;
                                      ppfVar3 = &(pVVar30->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar33 = uVar33 + 1;
                                    uVar22 = (pVVar30->super_VMapEntry).dims;
                                  } while (uVar33 < uVar22);
                                }
                              }
                              pVVar30 = pVVar30 + 1;
                            } while (pVVar30 != pVVar6);
                          }
                          pUVar31 = (local_230->mCurLayer->mUVChannels).
                                    super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pUVar8 = (local_230->mCurLayer->mUVChannels).
                                   super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          if (pUVar31 != pUVar8) {
                            do {
                              if ((pUVar31->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pUVar31->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar25 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pUVar31->super_VMapEntry).abAssigned,
                                           (ulong)(pUVar31->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pUVar31->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pUVar31->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pUVar31->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar33 = 0;
                                  do {
                                    pfVar19 = (pUVar31->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar25 * uVar22 + uVar33);
                                    iVar7._M_current =
                                         (pUVar31->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar7._M_current ==
                                        (pUVar31->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pUVar31->super_VMapEntry).rawData,iVar7,pfVar19);
                                    }
                                    else {
                                      *iVar7._M_current = *pfVar19;
                                      ppfVar3 = &(pUVar31->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar33 = uVar33 + 1;
                                    uVar22 = (pUVar31->super_VMapEntry).dims;
                                  } while (uVar33 < uVar22);
                                }
                              }
                              pUVar31 = pUVar31 + 1;
                            } while (pUVar31 != pUVar8);
                          }
                          pWVar32 = (local_230->mCurLayer->mWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar9 = (local_230->mCurLayer->mWeightChannels).
                                   super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar32 != pWVar9) {
                            do {
                              if ((pWVar32->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pWVar32->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar25 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar32->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar32->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar32->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar32->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pWVar32->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar33 = 0;
                                  do {
                                    pfVar19 = (pWVar32->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar25 * uVar22 + uVar33);
                                    iVar7._M_current =
                                         (pWVar32->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar7._M_current ==
                                        (pWVar32->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar32->super_VMapEntry).rawData,iVar7,pfVar19);
                                    }
                                    else {
                                      *iVar7._M_current = *pfVar19;
                                      ppfVar3 = &(pWVar32->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar33 = uVar33 + 1;
                                    uVar22 = (pWVar32->super_VMapEntry).dims;
                                  } while (uVar33 < uVar22);
                                }
                              }
                              pWVar32 = pWVar32 + 1;
                            } while (pWVar32 != pWVar9);
                          }
                          pWVar32 = (local_230->mCurLayer->mSWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar9 = (local_230->mCurLayer->mSWeightChannels).
                                   super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar32 != pWVar9) {
                            do {
                              if ((pWVar32->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pWVar32->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar25 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar32->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar32->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar32->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar32->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pWVar32->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar33 = 0;
                                  do {
                                    pfVar19 = (pWVar32->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar25 * uVar22 + uVar33);
                                    iVar7._M_current =
                                         (pWVar32->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar7._M_current ==
                                        (pWVar32->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar32->super_VMapEntry).rawData,iVar7,pfVar19);
                                    }
                                    else {
                                      *iVar7._M_current = *pfVar19;
                                      ppfVar3 = &(pWVar32->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar33 = uVar33 + 1;
                                    uVar22 = (pWVar32->super_VMapEntry).dims;
                                  } while (uVar33 < uVar22);
                                }
                              }
                              pWVar32 = pWVar32 + 1;
                            } while (pWVar32 != pWVar9);
                          }
                          this_01 = local_230;
                          pLVar10 = local_230->mCurLayer;
                          bVar13 = true;
                          uVar26 = local_1e8;
                          this_02 = local_1d0;
                          this_03 = local_1d8;
                          pFVar34 = local_1f0;
                          if ((pLVar10->mNormals).super_VMapEntry.name._M_string_length != 0) {
                            puVar1 = (pLVar10->mNormals).super_VMapEntry.abAssigned.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     + (uVar25 >> 6);
                            *puVar1 = *puVar1 | 1L << (bVar21 & 0x3f);
                            std::vector<bool,_std::allocator<bool>_>::resize
                                      (&(pLVar10->mNormals).super_VMapEntry.abAssigned,
                                       (ulong)(pLVar10->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_offset +
                                       ((long)(pLVar10->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_p -
                                       (long)(pLVar10->mNormals).super_VMapEntry.abAssigned.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p) * 8 + 1,false);
                            this_02 = local_1d0;
                            this_03 = local_1d8;
                            uVar22 = (pLVar10->mNormals).super_VMapEntry.dims;
                            uVar26 = local_1e8;
                            pFVar34 = local_1f0;
                            if (uVar22 != 0) {
                              uVar33 = 0;
                              do {
                                pfVar19 = (pLVar10->mNormals).super_VMapEntry.rawData.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                          (uVar25 * uVar22 + uVar33);
                                iVar7._M_current =
                                     (pLVar10->mNormals).super_VMapEntry.rawData.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                                if (iVar7._M_current ==
                                    (pLVar10->mNormals).super_VMapEntry.rawData.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<float,std::allocator<float>>::
                                  _M_realloc_insert<float_const&>
                                            ((vector<float,std::allocator<float>> *)
                                             &(pLVar10->mNormals).super_VMapEntry.rawData,iVar7,
                                             pfVar19);
                                }
                                else {
                                  *iVar7._M_current = *pfVar19;
                                  ppfVar3 = &(pLVar10->mNormals).super_VMapEntry.rawData.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_finish;
                                  *ppfVar3 = *ppfVar3 + 1;
                                }
                                uVar33 = uVar33 + 1;
                                uVar22 = (pLVar10->mNormals).super_VMapEntry.dims;
                                uVar26 = local_1e8;
                                this_01 = local_230;
                                pFVar34 = local_1f0;
                              } while (uVar33 < uVar22);
                            }
                          }
                        }
                        uVar24 = local_1c8 + 1;
                      } while (uVar24 < (pFVar34->super_aiFace).mNumIndices);
                    }
                    bVar11 = true;
                    if (!bVar13) {
                      pLVar20 = DefaultLogger::get();
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      basic_formatter<char[38]>
                                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,
                                 (char (*) [38])"LWO2: Failure evaluating VMAD entry \'");
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                                 local_228._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "\', vertex index wasn\'t found in that polygon",0x2c);
                      std::__cxx11::stringbuf::str();
                      Logger::warn(pLVar20,&local_260);
                      std::__cxx11::string::~string((string *)&local_260);
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                      __assert_fail("had",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/LWO/LWOLoader.cpp"
                                    ,0x467,
                                    "void Assimp::LWOImporter::LoadLWO2VertexMap(unsigned int, bool)"
                                   );
                    }
                  }
                  else {
                    pLVar20 = DefaultLogger::get();
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::basic_formatter<char[38]>
                              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)local_1a8,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'")
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                               local_228._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\', polygon index is out of range",0x20);
                    std::__cxx11::stringbuf::str();
                    Logger::warn(pLVar20,local_260._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                    this_01->mFileBuffer = this_01->mFileBuffer + (local_208->dims << 2);
                    bVar11 = false;
                  }
                }
                if (!bVar11) goto LAB_003eef46;
              }
              pfVar19 = (float *)operator_new__(local_1b0);
              if ((uint)local_1f8 != 0) {
                uVar24 = 0;
                puVar17 = (uint *)this_01->mFileBuffer;
                do {
                  uVar25 = *puVar17;
                  this_01->mFileBuffer = (uint8_t *)(puVar17 + 1);
                  pfVar19[uVar24] =
                       (float)(uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                              uVar25 << 0x18);
                  uVar24 = uVar24 + 1;
                  puVar17 = puVar17 + 1;
                } while (uVar26 != uVar24);
              }
              DoRecursiveVMAPAssignment(this_01,local_208,(uint)local_1f8,(uint)local_238,pfVar19);
              this_01->mFileBuffer = this_01->mFileBuffer + local_1b8;
              operator_delete__(pfVar19);
            }
            else {
              pLVar20 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[43]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [43])"LWO2: Failure evaluating VMAP/VMAD entry \'");
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\', vertex index is out of range",0x1f);
              std::__cxx11::stringbuf::str();
              Logger::warn(pLVar20,local_260._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              this_01->mFileBuffer = this_01->mFileBuffer + (local_208->dims << 2);
            }
LAB_003eef46:
            puVar17 = (uint *)this_01->mFileBuffer;
          } while (puVar17 < local_200);
        }
        goto LAB_003ef14f;
      }
      if (uVar22 == 0x4d4f5246) goto LAB_003ef14f;
    }
    else {
      if (uVar22 == 0x4e4f524d) {
        iVar14 = std::__cxx11::string::compare((char *)&local_228);
        if (((short)local_238 != 0x300 || iVar14 != 0) ||
           ((this_01->mCurLayer->mNormals).super_VMapEntry.name._M_string_length != 0))
        goto LAB_003ef14f;
        pLVar20 = DefaultLogger::get();
        Logger::info(pLVar20,"Processing non-standard extension: MODO VMAP.NORM.vert_normals");
        std::__cxx11::string::_M_assign
                  ((string *)&(this_01->mCurLayer->mNormals).super_VMapEntry.name);
        local_208 = &(this_01->mCurLayer->mNormals).super_VMapEntry;
        goto LAB_003ee605;
      }
      if (uVar22 == 0x5049434b) goto LAB_003ef14f;
    }
  }
  else if ((int)uVar22 < 0x53504f54) {
    if ((uVar22 == 0x52474220) || (uVar22 == 0x52474241)) {
      if (uVar28 - 5 < 0xfffffffe) {
        pLVar20 = DefaultLogger::get();
        std::operator+(&local_260,"LWO2: Skipping Color Map \'",&local_228);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_260);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar23 = plVar16 + 2;
        if ((long *)*plVar16 == plVar23) {
          local_1a8._16_8_ = *plVar23;
          local_1a8._24_8_ = plVar16[3];
        }
        else {
          local_1a8._16_8_ = *plVar23;
          local_1a8._0_8_ = (long *)*plVar16;
        }
        local_1a8._8_8_ = plVar16[1];
        *plVar16 = (long)plVar23;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        Logger::warn(pLVar20,(char *)local_1a8._0_8_);
LAB_003ef117:
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003ef14f;
      }
      local_208 = FindEntry<Assimp::LWO::VColorChannel>
                            (&local_230->mCurLayer->mVColorChannels,&local_228,(bool)(char)local_23c
                            );
      goto LAB_003ee605;
    }
  }
  else {
    if (uVar22 == 0x53504f54) goto LAB_003ef14f;
    if (uVar22 == 0x54585556) {
      if ((short)local_238 != 0x200) {
        pLVar20 = DefaultLogger::get();
        std::operator+(&local_260,"LWO2: Skipping UV channel \'",&local_228);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_260);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar23 = plVar16 + 2;
        if ((long *)*plVar16 == plVar23) {
          local_1a8._16_8_ = *plVar23;
          local_1a8._24_8_ = plVar16[3];
        }
        else {
          local_1a8._16_8_ = *plVar23;
          local_1a8._0_8_ = (long *)*plVar16;
        }
        local_1a8._8_8_ = plVar16[1];
        *plVar16 = (long)plVar23;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        Logger::warn(pLVar20,(char *)local_1a8._0_8_);
        goto LAB_003ef117;
      }
      local_208 = FindEntry<Assimp::LWO::UVChannel>
                            (&local_230->mCurLayer->mUVChannels,&local_228,(bool)(char)local_23c);
      goto LAB_003ee605;
    }
    if (uVar22 == 0x57474854) goto LAB_003ee492;
  }
  std::__cxx11::string::compare((char *)&local_228);
  pLVar20 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[43]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [43])"LWO2: Skipping unknown VMAP/VMAD channel \'");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar20,local_260._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_003ef14f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2VertexMap(unsigned int length, bool perPoly)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,VMAP,6);
    unsigned int type = GetU4();
    unsigned int dims = GetU2();

    VMapEntry* base;

    // read the name of the vertex map
    std::string name;
    GetS0(name,length);

    switch (type)
    {
    case AI_LWO_TXUV:
        if (dims != 2)  {
            ASSIMP_LOG_WARN("LWO2: Skipping UV channel \'"
            + name + "\' with !2 components");
            return;
        }
        base = FindEntry(mCurLayer->mUVChannels,name,perPoly);
        break;
    case AI_LWO_WGHT:
    case AI_LWO_MNVW:
        if (dims != 1)  {
            ASSIMP_LOG_WARN("LWO2: Skipping Weight Channel \'"
            + name + "\' with !1 components");
            return;
        }
        base = FindEntry((type == AI_LWO_WGHT ? mCurLayer->mWeightChannels
            : mCurLayer->mSWeightChannels),name,perPoly);
        break;
    case AI_LWO_RGB:
    case AI_LWO_RGBA:
        if (dims != 3 && dims != 4) {
            ASSIMP_LOG_WARN("LWO2: Skipping Color Map \'"
            + name + "\' with a dimension > 4 or < 3");
            return;
        }
        base = FindEntry(mCurLayer->mVColorChannels,name,perPoly);
        break;

    case AI_LWO_MODO_NORM:
        /*  This is a non-standard extension chunk used by Luxology's MODO.
         *  It stores per-vertex normals. This VMAP exists just once, has
         *  3 dimensions and is btw extremely beautiful.
         */
        if (name != "vert_normals" || dims != 3 || mCurLayer->mNormals.name.length())
            return;

        ASSIMP_LOG_INFO("Processing non-standard extension: MODO VMAP.NORM.vert_normals");

        mCurLayer->mNormals.name = name;
        base = & mCurLayer->mNormals;
        break;

    case AI_LWO_PICK: /* these VMAPs are just silently dropped */
    case AI_LWO_MORF:
    case AI_LWO_SPOT:
        return;

    default:
        if (name == "APS.Level") {
            // XXX handle this (seems to be subdivision-related).
        }
        ASSIMP_LOG_WARN_F("LWO2: Skipping unknown VMAP/VMAD channel \'", name, "\'");
        return;
    };
    base->Allocate((unsigned int)mCurLayer->mTempPoints.size());

    // now read all entries in the map
    type = std::min(dims,base->dims);
    const unsigned int diff = (dims - type)<<2u;

    LWO::FaceList& list = mCurLayer->mFaces;
    LWO::PointList& pointList = mCurLayer->mTempPoints;
    LWO::ReferrerList& refList = mCurLayer->mPointReferrers;

    const unsigned int numPoints = (unsigned int)pointList.size();
    const unsigned int numFaces  = (unsigned int)list.size();

    while (mFileBuffer < end)   {

        unsigned int idx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mPointIDXOfs;
        if (idx >= numPoints)   {
            ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAP/VMAD entry \'", name, "\', vertex index is out of range");
            mFileBuffer += base->dims<<2u;
            continue;
        }
        if (perPoly)    {
            unsigned int polyIdx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
            if (base->abAssigned[idx])  {
                // we have already a VMAP entry for this vertex - thus
                // we need to duplicate the corresponding polygon.
                if (polyIdx >= numFaces)    {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', polygon index is out of range");
                    mFileBuffer += base->dims<<2u;
                    continue;
                }

                LWO::Face& src = list[polyIdx];

                // generate a new unique vertex for the corresponding index - but only
                // if we can find the index in the face
                bool had = false;
                for (unsigned int i = 0; i < src.mNumIndices;++i)   {

                    unsigned int srcIdx = src.mIndices[i], tmp = idx;
                    do {
                        if (tmp == srcIdx)
                            break;
                    }
                    while ((tmp = refList[tmp]) != UINT_MAX);
                    if (tmp == UINT_MAX) {
                        continue;
                    }

                    had = true;
                    refList.resize(refList.size()+1, UINT_MAX);

                    idx = (unsigned int)pointList.size();
                    src.mIndices[i] = (unsigned int)pointList.size();

                    // store the index of the new vertex in the old vertex
                    // so we get a single linked list we can traverse in
                    // only one direction
                    AddToSingleLinkedList(refList,srcIdx,src.mIndices[i]);
                    pointList.push_back(pointList[srcIdx]);

                    CreateNewEntry(mCurLayer->mVColorChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mUVChannels,      srcIdx );
                    CreateNewEntry(mCurLayer->mWeightChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mSWeightChannels, srcIdx );
                    CreateNewEntry(mCurLayer->mNormals, srcIdx );
                }
                if (!had) {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', vertex index wasn't found in that polygon");
                    ai_assert(had);
                }
            }
        }

        std::unique_ptr<float[]> temp(new float[type]);
        for (unsigned int l = 0; l < type;++l)
            temp[l] = GetF4();

        DoRecursiveVMAPAssignment(base,type,idx, temp.get());
        mFileBuffer += diff;
    }
}